

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O0

bool crnlib::rg_etc1::etc1_block::unpack_color5
               (color_quad_u8 *result,uint16 packed_color5,uint16 packed_delta3,bool scaled,
               uint alpha)

{
  uint alpha_00;
  byte in_CL;
  uint16 in_DX;
  ushort in_SI;
  color_quad_u8 *in_RDI;
  uint in_R8D;
  bool success;
  int r;
  int g;
  int b;
  int dc_b;
  int dc_g;
  int dc_r;
  bool local_2d;
  uint local_2c;
  uint local_28;
  uint local_24;
  int local_20;
  int local_1c;
  int local_18;
  uint local_14;
  byte local_d;
  ushort local_a;
  color_quad_u8 *local_8;
  
  local_d = in_CL & 1;
  local_14 = in_R8D;
  local_a = in_SI;
  local_8 = in_RDI;
  unpack_delta3(&local_18,&local_1c,&local_20,in_DX);
  local_24 = (local_a & 0x1f) + local_20;
  local_28 = ((int)(uint)local_a >> 5 & 0x1fU) + local_1c;
  local_2c = ((int)(uint)local_a >> 10 & 0x1fU) + local_18;
  local_2d = 0x1f < (local_2c | local_28 | local_24);
  if (local_2d) {
    local_2c = clamp<int>(local_2c,0,0x1f);
    local_28 = clamp<int>(local_28,0,0x1f);
    local_24 = clamp<int>(local_24,0,0x1f);
  }
  local_2d = !local_2d;
  if ((local_d & 1) != 0) {
    local_24 = local_24 << 3 | (int)local_24 >> 2;
    local_28 = local_28 << 3 | (int)local_28 >> 2;
    local_2c = local_2c << 3 | (int)local_2c >> 2;
  }
  alpha_00 = minimum<unsigned_int>(local_14,0xff);
  color_quad_u8::set_noclamp_rgba(local_8,local_2c,local_28,local_24,alpha_00);
  return local_2d;
}

Assistant:

bool etc1_block::unpack_color5(color_quad_u8& result, uint16 packed_color5, uint16 packed_delta3, bool scaled, uint alpha) {
  int dc_r, dc_g, dc_b;
  unpack_delta3(dc_r, dc_g, dc_b, packed_delta3);

  int b = (packed_color5 & 31U) + dc_b;
  int g = ((packed_color5 >> 5U) & 31U) + dc_g;
  int r = ((packed_color5 >> 10U) & 31U) + dc_r;

  bool success = true;
  if (static_cast<uint>(r | g | b) > 31U) {
    success = false;
    r = rg_etc1::clamp<int>(r, 0, 31);
    g = rg_etc1::clamp<int>(g, 0, 31);
    b = rg_etc1::clamp<int>(b, 0, 31);
  }

  if (scaled) {
    b = (b << 3U) | (b >> 2U);
    g = (g << 3U) | (g >> 2U);
    r = (r << 3U) | (r >> 2U);
  }

  result.set_noclamp_rgba(r, g, b, rg_etc1::minimum(alpha, 255U));
  return success;
}